

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadedSharingTest::addTextureOperations(GLES2ThreadedSharingTest *this)

{
  value_type pEVar1;
  reference ppEVar2;
  CreateShader *pCVar3;
  ShaderSource *pSVar4;
  ShaderCompile *pSVar5;
  CreateProgram *this_00;
  AttachShader *pAVar6;
  LinkProgram *this_01;
  CreateTexture *this_02;
  TexImage2D *pTVar7;
  CopyTexImage2D *pCVar8;
  TexSubImage2D *pTVar9;
  CopyTexSubImage2D *pCVar10;
  RenderTexture *pRVar11;
  ReadPixels *pRVar12;
  CompareData *this_03;
  DeleteTexture *pDVar13;
  DeleteShader *pDVar14;
  DeleteProgram *this_04;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_300;
  undefined1 local_2e9;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_2e8;
  undefined1 local_2d1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_2d0;
  undefined1 local_2b9;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_2b8;
  undefined1 local_2a1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_2a0;
  undefined1 local_289;
  SharedPtr<tcu::ThreadUtil::DataBlock> local_288;
  SharedPtr<tcu::ThreadUtil::DataBlock> local_278;
  undefined1 local_261;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_260;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_250;
  undefined1 local_239;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_238;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_228;
  undefined1 local_218 [8];
  SharedPtr<tcu::ThreadUtil::DataBlock> pixels2;
  SharedPtr<tcu::ThreadUtil::DataBlock> pixels1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_1f0;
  undefined1 local_1d9;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_1d8;
  undefined1 local_1c1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_1c0;
  undefined1 local_1a9;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_1a8;
  undefined1 local_191;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_190;
  undefined1 local_179;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_178;
  undefined1 local_161;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_160;
  undefined1 local_149;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_148;
  undefined1 local_138 [8];
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> texture;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_120;
  undefined1 local_109;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_108;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_f8;
  undefined1 local_e1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_e0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_d0;
  undefined1 local_b9;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_b8;
  undefined1 local_a1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_a0;
  undefined1 local_89;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_88;
  undefined1 local_71;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_70;
  char *local_60;
  char *fragmentShaderSource;
  char *vertexShaderSource;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> program;
  undefined1 local_30 [8];
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> fragmentShader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> vertexShader;
  GLES2ThreadedSharingTest *this_local;
  
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
  if (((this->m_config).render & 1U) != 0) {
    fragmentShaderSource =
         "attribute highp vec2 a_pos;\nvarying mediump vec2 v_pos;\nvoid main(void)\n{\n\tv_pos = a_pos;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
    ;
    local_60 = 
    "varying mediump vec2 v_pos;\nuniform sampler2D u_sampler;\nvoid main(void)\n{\n\tgl_FragColor = texture2D(u_sampler, v_pos);\n}\n"
    ;
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pCVar3 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar3,0x8b31,
               (SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state,
               (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar3);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pSVar4 = (ShaderSource *)operator_new(0x98);
    local_71 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_70,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar4,&local_70,fragmentShaderSource,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_71 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar4);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_70);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pSVar5 = (ShaderCompile *)operator_new(0x78);
    local_89 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_88,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar5,&local_88,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_89 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar5);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_88);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pCVar3 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar3,0x8b30,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30,
               (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar3);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pSVar4 = (ShaderSource *)operator_new(0x98);
    local_a1 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_a0,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar4,&local_a0,local_60,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_a1 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar4);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_a0);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pSVar5 = (ShaderCompile *)operator_new(0x78);
    local_b9 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_b8,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar5,&local_b8,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_b9 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar5);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_b8);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    this_00 = (CreateProgram *)operator_new(0x78);
    GLES2ThreadTest::CreateProgram::CreateProgram
              (this_00,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource,
               (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_00);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pAVar6 = (AttachShader *)operator_new(0x88);
    local_e1 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_d0,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_e0,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
    GLES2ThreadTest::AttachShader::AttachShader
              (pAVar6,&local_d0,&local_e0,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_e1 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar6);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_e0);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_d0);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pAVar6 = (AttachShader *)operator_new(0x88);
    local_109 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_f8,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_108,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
    GLES2ThreadTest::AttachShader::AttachShader
              (pAVar6,&local_f8,&local_108,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_109 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar6);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_108);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_f8);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    this_01 = (LinkProgram *)operator_new(0x78);
    texture.m_state._7_1_ = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_120,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
    GLES2ThreadTest::LinkProgram::LinkProgram
              (this_01,&local_120,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    texture.m_state._7_1_ = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_01);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_120);
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)local_138);
  ppEVar2 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,0);
  pEVar1 = *ppEVar2;
  this_02 = (CreateTexture *)operator_new(0x78);
  GLES2ThreadTest::CreateTexture::CreateTexture
            (this_02,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)local_138,
             (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_02);
  if ((this->m_config).define == 1) {
    if (((this->m_config).modify == 0) && (((this->m_config).render & 1U) == 0)) {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar2;
      pTVar7 = (TexImage2D *)operator_new(0x90);
      local_161 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_160,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)local_138);
      GLES2ThreadTest::TexImage2D::TexImage2D
                (pTVar7,&local_160,0,0x1908,0x100,0x100,0x1908,0x1401,
                 (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
      local_161 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pTVar7);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_160);
    }
    else {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar2;
      pTVar7 = (TexImage2D *)operator_new(0x90);
      local_149 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_148,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)local_138);
      GLES2ThreadTest::TexImage2D::TexImage2D
                (pTVar7,&local_148,0,0x1908,0x100,0x100,0x1908,0x1401,
                 (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
      local_149 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pTVar7);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_148);
    }
  }
  if ((this->m_config).define == 2) {
    if (((this->m_config).modify == 0) && (((this->m_config).render & 1U) == 0)) {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar2;
      pCVar8 = (CopyTexImage2D *)operator_new(0x98);
      local_191 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_190,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)local_138);
      GLES2ThreadTest::CopyTexImage2D::CopyTexImage2D
                (pCVar8,&local_190,0,0x1908,0x11,0x11,0x100,0x100,0,
                 (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
      local_191 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar8);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_190);
    }
    else {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar2;
      pCVar8 = (CopyTexImage2D *)operator_new(0x98);
      local_179 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_178,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)local_138);
      GLES2ThreadTest::CopyTexImage2D::CopyTexImage2D
                (pCVar8,&local_178,0,0x1908,0x11,0x11,0x100,0x100,0,
                 (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
      local_179 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar8);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_178);
    }
  }
  if ((this->m_config).modify == 1) {
    if (((this->m_config).render & 1U) == 0) {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar2;
      pTVar9 = (TexSubImage2D *)operator_new(0x98);
      local_1c1 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_1c0,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)local_138);
      GLES2ThreadTest::TexSubImage2D::TexSubImage2D
                (pTVar9,&local_1c0,0,0x11,0x11,0x1d,0x1d,0x1908,0x1401,
                 (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
      local_1c1 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pTVar9);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_1c0);
    }
    else {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar2;
      pTVar9 = (TexSubImage2D *)operator_new(0x98);
      local_1a9 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_1a8,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)local_138);
      GLES2ThreadTest::TexSubImage2D::TexSubImage2D
                (pTVar9,&local_1a8,0,0x11,0x11,0x1d,0x1d,0x1908,0x1401,
                 (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
      local_1a9 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pTVar9);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_1a8);
    }
  }
  if ((this->m_config).modify == 2) {
    if (((this->m_config).render & 1U) == 0) {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar2;
      pCVar10 = (CopyTexSubImage2D *)operator_new(0x98);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_1f0,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)local_138);
      GLES2ThreadTest::CopyTexSubImage2D::CopyTexSubImage2D
                (pCVar10,&local_1f0,0,7,7,0x11,0x11,0x1d,0x1d,
                 (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar10);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_1f0);
    }
    else {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar2;
      pCVar10 = (CopyTexSubImage2D *)operator_new(0x98);
      local_1d9 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
                (&local_1d8,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)local_138);
      GLES2ThreadTest::CopyTexSubImage2D::CopyTexSubImage2D
                (pCVar10,&local_1d8,0,7,7,0x11,0x11,0x1d,0x1d,
                 (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
      local_1d9 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar10);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_1d8);
    }
  }
  if (((this->m_config).render & 1U) != 0) {
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::SharedPtr
              ((SharedPtr<tcu::ThreadUtil::DataBlock> *)&pixels2.m_state);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::SharedPtr
              ((SharedPtr<tcu::ThreadUtil::DataBlock> *)local_218);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pRVar11 = (RenderTexture *)operator_new(0x88);
    local_239 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_228,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
              (&local_238,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)local_138);
    GLES2ThreadTest::RenderTexture::RenderTexture
              (pRVar11,&local_228,&local_238,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_239 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar11);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_238);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_228);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,1);
    pEVar1 = *ppEVar2;
    pRVar11 = (RenderTexture *)operator_new(0x88);
    local_261 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_250,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
              (&local_260,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)local_138);
    GLES2ThreadTest::RenderTexture::RenderTexture
              (pRVar11,&local_250,&local_260,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_261 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar11);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_260);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_250);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pRVar12 = (ReadPixels *)operator_new(0x90);
    GLES2ThreadTest::ReadPixels::ReadPixels
              (pRVar12,0,0,400,400,0x1908,0x1401,
               (SharedPtr<tcu::ThreadUtil::DataBlock> *)&pixels2.m_state,
               (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar12);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,1);
    pEVar1 = *ppEVar2;
    pRVar12 = (ReadPixels *)operator_new(0x90);
    GLES2ThreadTest::ReadPixels::ReadPixels
              (pRVar12,0,0,400,400,0x1908,0x1401,(SharedPtr<tcu::ThreadUtil::DataBlock> *)local_218,
               (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar12);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    this_03 = (CompareData *)operator_new(0x58);
    local_289 = 1;
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::SharedPtr
              (&local_278,(SharedPtr<tcu::ThreadUtil::DataBlock> *)&pixels2.m_state);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::SharedPtr
              (&local_288,(SharedPtr<tcu::ThreadUtil::DataBlock> *)local_218);
    tcu::ThreadUtil::CompareData::CompareData(this_03,&local_278,&local_288);
    local_289 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_03);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::~SharedPtr(&local_288);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::~SharedPtr(&local_278);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::~SharedPtr
              ((SharedPtr<tcu::ThreadUtil::DataBlock> *)local_218);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::~SharedPtr
              ((SharedPtr<tcu::ThreadUtil::DataBlock> *)&pixels2.m_state);
  }
  if (((this->m_config).modify == 0) && (((this->m_config).render & 1U) == 0)) {
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,1);
    pEVar1 = *ppEVar2;
    pDVar13 = (DeleteTexture *)operator_new(0x78);
    local_2b9 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
              (&local_2b8,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)local_138);
    GLES2ThreadTest::DeleteTexture::DeleteTexture
              (pDVar13,&local_2b8,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_2b9 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar13);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_2b8);
  }
  else {
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pDVar13 = (DeleteTexture *)operator_new(0x78);
    local_2a1 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr
              (&local_2a0,(SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)local_138);
    GLES2ThreadTest::DeleteTexture::DeleteTexture
              (pDVar13,&local_2a0,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_2a1 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar13);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr(&local_2a0);
  }
  if (((this->m_config).render & 1U) != 0) {
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pDVar14 = (DeleteShader *)operator_new(0x78);
    local_2d1 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_2d0,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar14,&local_2d0,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_2d1 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar14);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_2d0);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pDVar14 = (DeleteShader *)operator_new(0x78);
    local_2e9 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_2e8,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar14,&local_2e8,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_2e9 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar14);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_2e8);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    this_04 = (DeleteProgram *)operator_new(0x78);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_300,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
    GLES2ThreadTest::DeleteProgram::DeleteProgram
              (this_04,&local_300,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_04);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_300);
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)local_138);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
  return;
}

Assistant:

void GLES2ThreadedSharingTest::addTextureOperations (void)
{
	// Add operations for verify
	SharedPtr<GLES2ThreadTest::Shader>	vertexShader;
	SharedPtr<GLES2ThreadTest::Shader>	fragmentShader;
	SharedPtr<GLES2ThreadTest::Program>	program;

	if (m_config.render)
	{
		const char* vertexShaderSource =
		"attribute highp vec2 a_pos;\n"
		"varying mediump vec2 v_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tv_pos = a_pos;\n"
		"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
		"}\n";

		const char* fragmentShaderSource =
		"varying mediump vec2 v_pos;\n"
		"uniform sampler2D u_sampler;\n"
		"void main(void)\n"
		"{\n"
		"\tgl_FragColor = texture2D(u_sampler, v_pos);\n"
		"}\n";

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_VERTEX_SHADER, vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(vertexShader, vertexShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_FRAGMENT_SHADER, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(fragmentShader, fragmentShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(fragmentShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateProgram(program, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::LinkProgram(program, m_config.useFenceSync, m_config.serverSync));
	}

	SharedPtr<GLES2ThreadTest::Texture> texture;

	m_threads[0]->addOperation(new GLES2ThreadTest::CreateTexture(texture, m_config.useFenceSync, m_config.serverSync));

	if (m_config.define == 1)
	{
		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::TexImage2D(texture, 0, GL_RGBA, 256, 256, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::TexImage2D(texture, 0, GL_RGBA, 256, 256, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.define == 2)
	{
		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::CopyTexImage2D(texture, 0, GL_RGBA, 17, 17, 256, 256, 0, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::CopyTexImage2D(texture, 0, GL_RGBA, 17, 17, 256, 256, 0, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify == 1)
	{
		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::TexSubImage2D(texture, 0, 17, 17, 29, 29, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::TexSubImage2D(texture, 0, 17, 17, 29, 29, GL_RGBA, GL_UNSIGNED_BYTE, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify == 2)
	{
		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::CopyTexSubImage2D(texture, 0, 7, 7, 17, 17, 29, 29, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::CopyTexSubImage2D(texture, 0, 7, 7, 17, 17, 29, 29, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.render)
	{
		SharedPtr<tcu::ThreadUtil::DataBlock> pixels1;
		SharedPtr<tcu::ThreadUtil::DataBlock> pixels2;

		m_threads[0]->addOperation(new GLES2ThreadTest::RenderTexture(program, texture, m_config.useFenceSync, m_config.serverSync));
		m_threads[1]->addOperation(new GLES2ThreadTest::RenderTexture(program, texture, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::ReadPixels(0, 0, 400, 400, GL_RGBA, GL_UNSIGNED_BYTE, pixels1, m_config.useFenceSync, m_config.serverSync));
		m_threads[1]->addOperation(new GLES2ThreadTest::ReadPixels(0, 0, 400, 400, GL_RGBA, GL_UNSIGNED_BYTE, pixels2, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new tcu::ThreadUtil::CompareData(pixels1, pixels2));
	}

	if (m_config.modify || m_config.render)
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteTexture(texture, m_config.useFenceSync, m_config.serverSync));
	else
		m_threads[1]->addOperation(new GLES2ThreadTest::DeleteTexture(texture, m_config.useFenceSync, m_config.serverSync));

	if (m_config.render)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteProgram(program, m_config.useFenceSync, m_config.serverSync));
	}
}